

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlsbench.c
# Opt level: O0

uint64_t bench_time(void)

{
  int iVar1;
  uint64_t micros;
  uint64_t nanos;
  timespec cpu;
  timeval tv;
  
  iVar1 = clock_gettime(2,(timespec *)&nanos);
  if (iVar1 == 0) {
    tv.tv_usec = nanos * 1000000 + (ulong)cpu.tv_sec / 1000;
  }
  else {
    gettimeofday((timeval *)&cpu.tv_nsec,(__timezone_ptr_t)0x0);
    tv.tv_usec = cpu.tv_nsec * 1000000 + tv.tv_sec;
  }
  return tv.tv_usec;
}

Assistant:

static uint64_t bench_time()
{
    struct timeval tv;
#ifdef CLOCK_PROCESS_CPUTIME_ID
    struct timespec cpu;
    if (clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &cpu) == 0){
        uint64_t nanos = (uint64_t) cpu.tv_nsec;
        uint64_t micros = nanos/1000;
        micros += (1000000ull)*((uint64_t)cpu.tv_sec);
        return micros;
    }
#endif
    gettimeofday(&tv, NULL);
    return (uint64_t)tv.tv_sec * 1000000 + tv.tv_usec;
}